

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_bind_error_inval(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b_1;
  int64_t eval_b_2;
  sockaddr_in addr2;
  sockaddr_in addr1;
  uv_tcp_t server;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr1);
  server.data = (void *)(long)iVar1;
  addr2.sin_family = 0;
  addr2.sin_port = 0;
  addr2.sin_addr.s_addr = 0;
  if (server.data == (void *)0x0) {
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,&addr2);
    server.data = (void *)(long)iVar1;
    if (server.data == (void *)0x0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_tcp_init(puVar2,&server);
      eval_b_1 = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b_1 == (void *)0x0) {
        iVar1 = uv_tcp_bind(&server,(sockaddr *)&addr1,0);
        eval_b_1 = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b_1 == (void *)0x0) {
          iVar1 = uv_tcp_bind(&server,(sockaddr *)&addr2,0);
          eval_b_1 = (int64_t)iVar1;
          eval_b_2 = -0x16;
          if ((void *)eval_b_1 == (void *)0xffffffffffffffea) {
            uv_close((uv_handle_t *)&server,close_cb);
            puVar2 = uv_default_loop();
            uv_run(puVar2,UV_RUN_DEFAULT);
            eval_b_1 = 1;
            eval_b_2 = (int64_t)close_cb_called;
            if (eval_b_2 == 1) {
              puVar2 = uv_default_loop();
              close_loop(puVar2);
              eval_b_1 = 0;
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              eval_b_2 = (int64_t)iVar1;
              if (eval_b_2 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar5 = "uv_loop_close(uv_default_loop())";
              pcVar4 = "0";
              uVar3 = 0xd1;
            }
            else {
              pcVar5 = "close_cb_called";
              pcVar4 = "1";
              uVar3 = 0xcf;
            }
          }
          else {
            pcVar5 = "UV_EINVAL";
            pcVar4 = "r";
            uVar3 = 0xc9;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "r";
          uVar3 = 199;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "r";
        uVar3 = 0xc5;
      }
      goto LAB_0017e13f;
    }
    pcVar4 = "uv_ip4_addr(\"0.0.0.0\", 9124, &addr2)";
    uVar3 = 0xc2;
  }
  else {
    pcVar4 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr1)";
    uVar3 = 0xc1;
  }
  eval_b_2 = 0;
  pcVar5 = "0";
  eval_b_1 = (int64_t)server.data;
LAB_0017e13f:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b_1,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind_error_inval) {
  struct sockaddr_in addr1;
  struct sockaddr_in addr2;
  uv_tcp_t server;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr1));
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT_2, &addr2));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr1, 0);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr2, 0);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}